

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_gap(REF_GEOM ref_geom,REF_INT node,REF_DBL *gap)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  REF_BOOL has_edge;
  REF_BOOL has_node;
  REF_DBL face_xyz [3];
  int local_40;
  int local_3c;
  REF_DBL local_38 [4];
  
  *gap = 0.0;
  uVar5 = ref_geom_is_a(ref_geom,node,0,&local_3c);
  if (uVar5 == 0) {
    uVar5 = ref_geom_is_a(ref_geom,node,1,&local_40);
    if (uVar5 == 0) {
      if (local_40 == 0) {
        return 0;
      }
      if (node < 0) {
        return 0;
      }
      pRVar1 = ref_geom->ref_adj;
      if ((node < pRVar1->nnode) && (lVar6 = (long)pRVar1->first[(uint)node], lVar6 != -1)) {
        iVar3 = (uint)(local_3c == 0) * 2;
        iVar8 = pRVar1->item[lVar6].ref;
        if (iVar3 != ref_geom->descr[(long)iVar8 * 6]) {
          pRVar2 = ref_geom->ref_adj->item;
          do {
            lVar6 = (long)pRVar2[(int)lVar6].next;
            if (lVar6 == -1) {
              if (node < 0) {
                return 0;
              }
              goto LAB_0020c3f0;
            }
            iVar8 = pRVar2[lVar6].ref;
          } while (iVar3 != ref_geom->descr[(long)iVar8 * 6]);
        }
        uVar5 = ref_egads_eval(ref_geom,iVar8,local_38,(REF_DBL *)0x0);
        uVar7 = 0xefe;
      }
      else {
LAB_0020c3f0:
        pRVar1 = ref_geom->ref_adj;
        if (pRVar1->nnode <= node) {
          return 0;
        }
        lVar6 = (long)pRVar1->first[(uint)node];
        if (lVar6 == -1) {
          return 0;
        }
        iVar8 = pRVar1->item[lVar6].ref;
        if (ref_geom->descr[(long)iVar8 * 6] != 2) {
          pRVar2 = ref_geom->ref_adj->item;
          do {
            lVar6 = (long)pRVar2[(int)lVar6].next;
            if (lVar6 == -1) {
              return 0;
            }
            iVar8 = pRVar2[lVar6].ref;
          } while (ref_geom->descr[(long)iVar8 * 6] != 2);
        }
        uVar5 = ref_egads_eval(ref_geom,iVar8,local_38,(REF_DBL *)0x0);
        uVar7 = 0xf04;
      }
      pcVar4 = "egads eval";
      goto LAB_0020c32e;
    }
    uVar7 = 0xef4;
  }
  else {
    uVar7 = 0xef3;
  }
  pcVar4 = "bcast n";
LAB_0020c32e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",uVar7,
         "ref_egads_gap",(ulong)uVar5,pcVar4 + 6);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_egads_gap(REF_GEOM ref_geom, REF_INT node,
                                 REF_DBL *gap) {
  REF_INT item, geom, type;
  REF_DBL dist, face_xyz[3], gap_xyz[3];
  REF_BOOL has_node, has_edge;
  *gap = 0.0;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &has_node), "n");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &has_edge), "n");
  if (!has_edge) return REF_SUCCESS;

  if (has_node) {
    type = REF_GEOM_NODE;
  } else {
    type = REF_GEOM_FACE;
  }
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, gap_xyz, NULL), "eval");
    }
  }

  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, face_xyz, NULL), "eval");
      dist = sqrt(pow(face_xyz[0] - gap_xyz[0], 2) +
                  pow(face_xyz[1] - gap_xyz[1], 2) +
                  pow(face_xyz[2] - gap_xyz[2], 2));
      (*gap) = MAX((*gap), dist);
    }
  }

  return REF_SUCCESS;
}